

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::char_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
           *this,align_spec *spec,char_writer *f)

{
  ulong uVar1;
  wchar_t wVar2;
  wchar_t __tmp;
  ulong uVar3;
  long lVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  wchar_t wVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  wchar_t local_28 [2];
  
  uVar7 = (ulong)spec->width_;
  if (uVar7 < 2) {
    wVar2 = f->value;
    pwVar5 = *(wchar_t **)this;
    uVar7 = *(ulong *)(this + 0x10);
    *(ulong *)(this + 0x10) = uVar7 + 1;
    if (uVar7 < *(ulong *)(this + 8)) {
      *(wchar_t **)this = pwVar5 + 1;
    }
    else {
      pwVar5 = local_28;
    }
    *pwVar5 = wVar2;
  }
  else {
    wVar2 = spec->fill_;
    uVar1 = uVar7 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar6 = uVar1 >> 1;
      pwVar5 = *(wchar_t **)this;
      uVar8 = *(ulong *)(this + 8);
      uVar3 = *(ulong *)(this + 0x10);
      wVar9 = *(wchar_t *)(this + 0x18);
      uVar10 = uVar3;
      uVar12 = uVar6;
      if (spec->width_ != 2) {
        do {
          if (uVar10 < uVar8) {
            *pwVar5 = wVar2;
            lVar11 = 4;
          }
          else {
            lVar11 = 0;
            wVar9 = wVar2;
          }
          pwVar5 = (wchar_t *)((long)pwVar5 + lVar11);
          uVar12 = uVar12 - 1;
          uVar10 = uVar10 + 1;
        } while (uVar12 != 0);
        uVar3 = uVar3 + uVar6;
      }
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar8;
      *(ulong *)(this + 0x10) = uVar3;
      *(wchar_t *)(this + 0x18) = wVar9;
      wVar9 = f->value;
      *(ulong *)(this + 0x10) = uVar3 + 1;
      if (uVar3 < uVar8) {
        *(wchar_t **)this = pwVar5 + 1;
      }
      else {
        pwVar5 = local_28;
      }
      *pwVar5 = wVar9;
      pwVar5 = *(wchar_t **)this;
      uVar8 = *(ulong *)(this + 8);
      uVar3 = *(ulong *)(this + 0x10);
      wVar9 = *(wchar_t *)(this + 0x18);
      if (uVar1 - uVar6 != 0) {
        lVar11 = (uVar6 - uVar7) + 1;
        uVar7 = uVar3;
        do {
          if (uVar7 < uVar8) {
            *pwVar5 = wVar2;
            lVar4 = 4;
          }
          else {
            lVar4 = 0;
            wVar9 = wVar2;
          }
          uVar7 = uVar7 + 1;
          pwVar5 = (wchar_t *)((long)pwVar5 + lVar4);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
        uVar3 = uVar3 + (uVar1 - uVar6);
      }
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar8;
      *(ulong *)(this + 0x10) = uVar3;
      *(wchar_t *)(this + 0x18) = wVar9;
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pwVar5 = *(wchar_t **)this;
      uVar7 = *(ulong *)(this + 8);
      uVar8 = *(ulong *)(this + 0x10);
      wVar9 = *(wchar_t *)(this + 0x18);
      uVar3 = uVar1;
      uVar10 = uVar8;
      if (uVar1 != 0) {
        do {
          if (uVar10 < uVar7) {
            *pwVar5 = wVar2;
            lVar11 = 4;
          }
          else {
            lVar11 = 0;
            wVar9 = wVar2;
          }
          pwVar5 = (wchar_t *)((long)pwVar5 + lVar11);
          uVar3 = uVar3 - 1;
          uVar10 = uVar10 + 1;
        } while (uVar3 != 0);
        uVar8 = uVar8 + uVar1;
      }
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar7;
      *(ulong *)(this + 0x10) = uVar8;
      *(wchar_t *)(this + 0x18) = wVar9;
      wVar2 = f->value;
      *(ulong *)(this + 0x10) = uVar8 + 1;
      if (uVar8 < uVar7) {
        *(wchar_t **)this = pwVar5 + 1;
      }
      else {
        pwVar5 = local_28;
      }
      *pwVar5 = wVar2;
    }
    else {
      wVar9 = f->value;
      pwVar5 = *(wchar_t **)this;
      uVar7 = *(ulong *)(this + 0x10);
      *(ulong *)(this + 0x10) = uVar7 + 1;
      if (uVar7 < *(ulong *)(this + 8)) {
        *(wchar_t **)this = pwVar5 + 1;
      }
      else {
        pwVar5 = local_28;
      }
      *pwVar5 = wVar9;
      pwVar5 = *(wchar_t **)this;
      uVar7 = *(ulong *)(this + 8);
      uVar8 = *(ulong *)(this + 0x10);
      wVar9 = *(wchar_t *)(this + 0x18);
      uVar3 = uVar8;
      uVar10 = uVar1;
      if (uVar1 != 0) {
        do {
          if (uVar3 < uVar7) {
            *pwVar5 = wVar2;
            lVar11 = 4;
          }
          else {
            lVar11 = 0;
            wVar9 = wVar2;
          }
          pwVar5 = (wchar_t *)((long)pwVar5 + lVar11);
          uVar10 = uVar10 - 1;
          uVar3 = uVar3 + 1;
        } while (uVar10 != 0);
        uVar8 = uVar8 + uVar1;
      }
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar7;
      *(ulong *)(this + 0x10) = uVar8;
      *(wchar_t *)(this + 0x18) = wVar9;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }